

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O0

int ARKBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                    void *bp_data)

{
  ARKodeMem ark_mem_00;
  int iVar1;
  undefined4 *in_RCX;
  int in_EDX;
  SUNMatrix in_R8;
  SUNLinearSolver in_XMM1_Qa;
  int retval;
  ARKodeMem ark_mem;
  ARKBandPrecData pdata;
  N_Vector in_stack_000000a0;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  N_Vector in_stack_000000b0;
  N_Vector in_stack_000000b8;
  sunrealtype in_stack_000000c0;
  ARKBandPrecData in_stack_000000c8;
  SUNMatrix p_Var2;
  int local_4;
  
  ark_mem_00 = (ARKodeMem)in_R8[3].content;
  p_Var2 = in_R8;
  if (in_EDX == 0) {
    *in_RCX = 1;
    iVar1 = SUNMatZero(in_R8[1].content);
    if (iVar1 < 0) {
      arkProcessError(ark_mem_00,-1,0x165,"ARKBandPrecSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = ARKBandPDQJac(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                          (N_Vector)CONCAT44(in_stack_000000ac,in_stack_000000a8),in_stack_000000a0)
    ;
    if (iVar1 < 0) {
      arkProcessError(ark_mem_00,-1,0x16e,"ARKBandPrecSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"The right-hand side routine failed in an unrecoverable manner.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = SUNMatCopy(in_R8[1].content,in_R8[1].ops);
    if (iVar1 < 0) {
      arkProcessError(ark_mem_00,-1,0x177,"ARKBandPrecSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  else {
    *in_RCX = 0;
    iVar1 = SUNMatCopy(in_R8[1].content,in_R8[1].ops);
    if (iVar1 < 0) {
      arkProcessError(ark_mem_00,-1,0x158,"ARKBandPrecSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  iVar1 = SUNMatScaleAddI((ulong)in_XMM1_Qa ^ 0x8000000000000000,in_R8[1].ops);
  if (iVar1 == 0) {
    local_4 = SUNLinSolSetup_Band(in_XMM1_Qa,p_Var2);
  }
  else {
    arkProcessError(ark_mem_00,-1,0x182,"ARKBandPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                    ,"An error arose from a SUNBandMatrix routine.");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int ARKBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                            sunbooleantype jok, sunbooleantype* jcurPtr,
                            sunrealtype gamma, void* bp_data)
{
  ARKBandPrecData pdata;
  ARKodeMem ark_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (ARKBandPrecData)bp_data;

  ark_mem = (ARKodeMem)pdata->arkode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call ARKBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = ARKBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}